

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O2

coord * gettrack(int x,int y)

{
  int iVar1;
  coord *pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  pcVar2 = utrack + utpnt;
  iVar4 = utcnt;
  do {
    while( true ) {
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) {
        return (coord *)0x0;
      }
      bVar6 = pcVar2 == utrack;
      pcVar2 = pcVar2 + -1;
      if (bVar6) {
        pcVar2 = utrack + 0x31;
      }
      iVar1 = distmin(x,y,(int)pcVar2->x,(int)pcVar2->y);
      if (iVar1 < 3) break;
      uVar3 = iVar1 - 2;
      iVar5 = iVar4 - uVar3;
      if (iVar5 == 0 || iVar4 < (int)uVar3) {
        return (coord *)0x0;
      }
      iVar4 = iVar5;
      if (pcVar2 < utrack + uVar3) {
        pcVar2 = pcVar2 + (0x34 - iVar1);
      }
      else {
        pcVar2 = pcVar2 + -(ulong)uVar3;
      }
    }
  } while (iVar1 == 2);
  if (iVar1 == 0) {
    pcVar2 = (coord *)0x0;
  }
  return pcVar2;
}

Assistant:

coord *gettrack(int x, int y)
{
    int cnt, ndist;
    coord *tc;
    cnt = utcnt;
    for (tc = &utrack[utpnt]; cnt--; ){
	if (tc == utrack) tc = &utrack[UTSZ-1];
	else tc--;
	ndist = distmin(x,y,tc->x,tc->y);

	/* if far away, skip track entries til we're closer */
	if (ndist > 2) {
	    ndist -= 2; /* be careful due to extra decrement at top of loop */
	    cnt -= ndist;
	    if (cnt <= 0)
		return NULL; /* too far away, no matches possible */
	    if (tc < &utrack[ndist])
		tc += (UTSZ-ndist);
	    else
		tc -= ndist;
	} else if (ndist <= 1)
	    return ndist ? tc : 0;
    }
    return NULL;
}